

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vga_ManRollBack(Vta_Man_t *p,int nObjOld)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vta_Obj_t *pVVar4;
  int *piVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Vta_Obj_t *pVVar11;
  int *piVar12;
  
  pVVar4 = p->pObjs;
  iVar10 = p->nObjs;
  if (nObjOld < iVar10) {
    piVar5 = p->pBins;
    pVVar11 = pVVar4 + nObjOld;
    do {
      iVar1 = pVVar11->iObj;
      iVar2 = pVVar11->iFrame;
      uVar8 = (uint)((iVar2 + iVar1 + 1) * (iVar2 + iVar1)) % (uint)p->nBins;
      uVar9 = piVar5[(int)uVar8];
      if (((int)uVar9 < 0) || (iVar3 = p->nObjs, iVar3 <= (int)uVar9)) goto LAB_0062d104;
      if (uVar9 == 0) {
LAB_0062d0e5:
        __assert_fail("pThis != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                      ,0x145,"void Vga_ManDelete(Vta_Man_t *, int, int)");
      }
      piVar12 = piVar5 + (int)uVar8;
      while( true ) {
        if ((pVVar4[uVar9].iObj == iVar1) && (pVVar4[uVar9].iFrame == iVar2)) break;
        uVar8 = pVVar4[uVar9].iNext;
        if (((int)uVar8 < 0) || (iVar3 <= (int)uVar8)) goto LAB_0062d104;
        piVar12 = &pVVar4[uVar9].iNext;
        uVar9 = uVar8;
        if (uVar8 == 0) {
          if (0 < iVar3) goto LAB_0062d0e5;
          goto LAB_0062d104;
        }
      }
      *piVar12 = pVVar4[uVar9].iNext;
      pVVar4[uVar9].iNext = -1;
      pVVar11 = pVVar11 + 1;
    } while (pVVar11 < pVVar4 + iVar10);
    iVar10 = p->nObjs;
  }
  memset(pVVar4 + nObjOld,0,(long)(iVar10 - nObjOld) << 4);
  p->nObjs = nObjOld;
  pVVar7 = p->vAddedNew;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      uVar9 = pVVar7->pArray[lVar6];
      if ((int)uVar9 < p->nObjs) {
        if ((int)uVar9 < 0) {
LAB_0062d104:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
        }
        uVar8 = *(uint *)&p->pObjs[uVar9].field_0xc;
        if ((uVar8 >> 0x1e & 1) == 0) {
          __assert_fail("pThis->fAdded == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x558,"void Vga_ManRollBack(Vta_Man_t *, int)");
        }
        *(uint *)&p->pObjs[uVar9].field_0xc = uVar8 & 0xbfffffff;
        pVVar7 = p->vAddedNew;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Vga_ManRollBack( Vta_Man_t * p, int nObjOld )
{
    Vta_Obj_t * pThis  = p->pObjs + nObjOld;
    Vta_Obj_t * pLimit = p->pObjs + p->nObjs;
    int i, Entry;
    for ( ; pThis < pLimit; pThis++ )
        Vga_ManDelete( p, pThis->iObj, pThis->iFrame );
    memset( p->pObjs + nObjOld, 0, sizeof(Vta_Obj_t) * (p->nObjs - nObjOld) );
    p->nObjs = nObjOld;
    Vec_IntForEachEntry( p->vAddedNew, Entry, i )
        if ( Entry < p->nObjs )
        {
            pThis = Vta_ManObj(p, Entry);
            assert( pThis->fAdded == 1 );
            pThis->fAdded = 0;
        }
}